

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O0

Matrix2f operator*(Matrix2f *x,Matrix2f *y)

{
  float fVar1;
  float *pfVar2;
  Matrix2f *in_RDX;
  float fVar3;
  ulong extraout_XMM0_Qa;
  ulong in_XMM1_Qa;
  Matrix2f MVar5;
  undefined4 local_2c;
  undefined4 local_28;
  int k;
  int j;
  int i;
  Matrix2f *y_local;
  Matrix2f *x_local;
  Matrix2f *product;
  ulong uVar4;
  
  Matrix2f::Matrix2f(x,0.0);
  uVar4 = extraout_XMM0_Qa;
  for (k = 0; k < 2; k = k + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
        pfVar2 = Matrix2f::operator()(y,k,local_28);
        fVar3 = *pfVar2;
        pfVar2 = Matrix2f::operator()(in_RDX,local_28,local_2c);
        fVar1 = *pfVar2;
        pfVar2 = Matrix2f::operator()(x,k,local_2c);
        in_XMM1_Qa = (ulong)(uint)*pfVar2;
        fVar3 = fVar3 * fVar1 + *pfVar2;
        uVar4 = (ulong)(uint)fVar3;
        *pfVar2 = fVar3;
      }
    }
  }
  MVar5.m_elements[2] = (float)(int)in_XMM1_Qa;
  MVar5.m_elements[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  MVar5.m_elements[0] = (float)(int)uVar4;
  MVar5.m_elements[1] = (float)(int)(uVar4 >> 0x20);
  return (Matrix2f)MVar5.m_elements;
}

Assistant:

Matrix2f operator * ( const Matrix2f& x, const Matrix2f& y )
{
	Matrix2f product; // zeroes

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			for( int k = 0; k < 2; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}